

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O2

void fiobj_ary_push(FIOBJ ary,FIOBJ obj)

{
  fio_ary___s *ary_00;
  size_t sVar1;
  ulong uVar2;
  
  if (ary != 0) {
    sVar1 = fiobj_type_is(ary,(fiobj_type_enum)obj);
    if (sVar1 != 0) {
      ary_00 = (fio_ary___s *)(ary + 8);
      uVar2 = *(ulong *)(ary + 0x10);
      if (*(ulong *)(ary + 0x18) <= uVar2) {
        fio_ary_____require_on_top(ary_00,5);
        uVar2 = *(size_t *)(ary + 0x10);
      }
      if (ary_00->start == uVar2) {
        ary_00->start = 0;
        *(undefined8 *)(ary + 0x10) = 0;
        uVar2 = 0;
      }
      *(FIOBJ *)(*(long *)(ary + 0x20) + uVar2 * 8) = obj;
      *(long *)(ary + 0x10) = *(long *)(ary + 0x10) + 1;
      return;
    }
  }
  __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                ,0x9a,"void fiobj_ary_push(FIOBJ, FIOBJ)");
}

Assistant:

void fiobj_ary_push(FIOBJ ary, FIOBJ obj) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  fio_ary___push(&obj2ary(ary)->ary, obj);
}